

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

int gen_iwmmxt_shift(TCGContext_conflict1 *tcg_ctx,uint32_t insn,uint32_t mask,TCGv_i32 dest)

{
  TCGTemp *pTVar1;
  uint uVar2;
  uintptr_t o;
  uintptr_t o_1;
  TCGv_i32 ret;
  
  uVar2 = insn & 0xf;
  if ((insn >> 8 & 1) == 0) {
    pTVar1 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
    ret = (TCGv_i32)((long)pTVar1 - (long)tcg_ctx);
    tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_ld_i64,(TCGArg)(tcg_ctx->cpu_V0 + (long)tcg_ctx),
                        (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(uVar2 * 8 + 0x2f18));
    tcg_gen_extrl_i64_i32_aarch64(tcg_ctx,ret,tcg_ctx->cpu_V0);
  }
  else {
    if (uVar2 - 0xc < 0xfffffffc) {
      return 1;
    }
    pTVar1 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
    ret = (TCGv_i32)((long)pTVar1 - (long)tcg_ctx);
    tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_ld_i32,(TCGArg)pTVar1,
                        (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(uVar2 * 4 + 0x2fa0));
  }
  tcg_gen_andi_i32_aarch64(tcg_ctx,ret,ret,mask);
  if (ret != dest) {
    tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(dest + (long)tcg_ctx),
                        (TCGArg)(ret + (long)tcg_ctx));
  }
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return 0;
}

Assistant:

static inline int gen_iwmmxt_shift(TCGContext *tcg_ctx, uint32_t insn, uint32_t mask, TCGv_i32 dest)
{
    int rd = (insn >> 0) & 0xf;
    TCGv_i32 tmp;

    if (insn & (1 << 8)) {
        if (rd < ARM_IWMMXT_wCGR0 || rd > ARM_IWMMXT_wCGR3) {
            return 1;
        } else {
            tmp = iwmmxt_load_creg(tcg_ctx, rd);
        }
    } else {
        tmp = tcg_temp_new_i32(tcg_ctx);
        iwmmxt_load_reg(tcg_ctx, tcg_ctx->cpu_V0, rd);
        tcg_gen_extrl_i64_i32(tcg_ctx, tmp, tcg_ctx->cpu_V0);
    }
    tcg_gen_andi_i32(tcg_ctx, tmp, tmp, mask);
    tcg_gen_mov_i32(tcg_ctx, dest, tmp);
    tcg_temp_free_i32(tcg_ctx, tmp);
    return 0;
}